

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_acceptor.h
# Opt level: O1

void __thiscall
cppcms::impl::cgi::
socket_acceptor<cppcms::impl::cgi::scgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::scgi>_>
::async_accept(socket_acceptor<cppcms::impl::cgi::scgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::scgi>_>
               *this)

{
  scgi *__p;
  stream_socket *psVar1;
  shared_ptr<cppcms::impl::cgi::scgi> api;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> iStack_38;
  scgi *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  if (this->stopped_ == false) {
    __p = server_api_factory<cppcms::impl::cgi::scgi>::operator()
                    ((server_api_factory<cppcms::impl::cgi::scgi> *)&this->field_0x64,this->srv_);
    local_30 = __p;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<cppcms::impl::cgi::scgi*>
              (&local_28,__p);
    std::__shared_ptr<cppcms::impl::cgi::scgi,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<cppcms::impl::cgi::scgi,cppcms::impl::cgi::scgi>
              ((__shared_ptr<cppcms::impl::cgi::scgi,(__gnu_cxx::_Lock_policy)2> *)&local_30,__p);
    (this->api_).super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = &local_30->super_connection;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->api_).
                super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,&local_28);
    psVar1 = &local_30->socket_;
    this->asio_socket_ = psVar1;
    booster::callback<void(std::error_code_const&)>::
    callback<cppcms::impl::cgi::socket_acceptor<cppcms::impl::cgi::scgi,cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::scgi>>::accept_binder>
              ((callback<void(std::error_code_const&)> *)&iStack_38,(accept_binder)this);
    booster::aio::acceptor::async_accept((stream_socket *)&this->acceptor_,(callback *)psVar1);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
              (&iStack_38);
    if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
    }
  }
  return;
}

Assistant:

virtual void async_accept()
			{
				if(stopped_)
					return;
				booster::shared_ptr<ServerAPI> api(factory_(srv_));
				api_=api;
				asio_socket_ = &api->socket_;
				acceptor_.async_accept(*asio_socket_,accept_binder(this));
			}